

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O2

dynamic_string * __thiscall crnlib::dynamic_string::set(dynamic_string *this,char *p,uint max_len)

{
  bool bVar1;
  size_t sVar2;
  char *__dest;
  uint len;
  
  sVar2 = strlen(p);
  len = (uint)sVar2;
  if (max_len < (uint)sVar2) {
    len = max_len;
  }
  if (len - 0xffff < 0xffff0002) {
    clear(this);
  }
  else {
    __dest = this->m_pStr;
    if (((__dest == (char *)0x0) || (p < __dest)) || (__dest + this->m_buf_size <= p)) {
      bVar1 = ensure_buf(this,len,false);
      if (bVar1) {
        this->m_len = (uint16)len;
        memcpy(this->m_pStr,p,(ulong)(len + 1));
      }
    }
    else {
      if (__dest != p) {
        memmove(__dest,p,(ulong)len);
        __dest = this->m_pStr;
      }
      __dest[len] = '\0';
      this->m_len = (uint16)len;
    }
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::set(const char* p, uint max_len)
    {
        CRNLIB_ASSERT(p);

        const uint len = math::minimum<uint>(max_len, static_cast<uint>(strlen(p)));
        CRNLIB_ASSERT(len < cUINT16_MAX);

        if ((!len) || (len >= cUINT16_MAX))
        {
            clear();
        }
        else if ((m_pStr) && (p >= m_pStr) && (p < (m_pStr + m_buf_size)))
        {
            if (m_pStr != p)
            {
                memmove(m_pStr, p, len);
            }
            m_pStr[len] = '\0';
            m_len = static_cast<uint16>(len);
        }
        else if (ensure_buf(len, false))
        {
            m_len = static_cast<uint16>(len);
            memcpy(m_pStr, p, m_len + 1);
        }

        check();

        return *this;
    }